

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall dtc::fdt::device_tree::parse_dtb(device_tree *this,string *fn,FILE *param_2)

{
  node_ptr *this_00;
  device_tree *pdVar1;
  undefined1 this_01 [8];
  bool bVar2;
  char *__ptr;
  size_t sStack_e0;
  uint32_t token;
  device_tree *local_d0;
  uint64_t length;
  uint64_t start;
  undefined1 local_b8 [8];
  input_buffer struct_table;
  header h;
  undefined1 local_70 [16];
  input_buffer strings_table;
  input_buffer reservation_map;
  
  input_buffer::buffer_for_file((input_buffer *)local_b8,fn,true);
  this_01 = local_b8;
  if (local_b8 == (undefined1  [8])0x0) {
    this->valid = false;
    return;
  }
  h.magic = 0xd00dfeed;
  h.version = 0x11;
  h.last_comp_version = 0x10;
  h.boot_cpuid_phys = 0;
  bVar2 = dtb::header::read_dtb(&h,(input_buffer *)local_b8);
  this->valid = bVar2;
  this->boot_cpu = h.boot_cpuid_phys;
  if (0x11 < h.last_comp_version) {
    fwrite("Don\'t know how to read this version of the device tree blob",0x3b,1,_stderr);
    this->valid = false;
    goto LAB_0013083b;
  }
  if (!bVar2) goto LAB_0013083b;
  input_buffer::buffer_from_offset(&reservation_map,(input_buffer *)this_01,h.off_mem_rsvmap,0);
  local_d0 = this;
  do {
    bVar2 = input_buffer::consume_binary<unsigned_long>(&reservation_map,&start);
    if ((!bVar2) ||
       (bVar2 = input_buffer::consume_binary<unsigned_long>(&reservation_map,&length), !bVar2)) {
      fwrite("Failed to read memory reservation table\n",0x28,1,_stderr);
      local_d0->valid = false;
      goto LAB_0013083b;
    }
    if (start == 0 && length == 0) break;
    struct_table._vptr_input_buffer = (_func_int **)start;
    struct_table.buffer = (char *)length;
    std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<std::pair<unsigned_long,unsigned_long>>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&this->reservations,(pair<unsigned_long,_unsigned_long> *)&struct_table);
  } while (length != 0 || start != 0);
  input_buffer::buffer_from_offset
            (&struct_table,(input_buffer *)this_01,h.off_dt_struct,h.size_dt_struct);
  input_buffer::buffer_from_offset
            (&strings_table,(input_buffer *)this_01,h.off_dt_strings,h.size_dt_strings);
  pdVar1 = local_d0;
  bVar2 = input_buffer::consume_binary<unsigned_int>(&struct_table,&token);
  if ((bVar2) && (token == 1)) {
    node::parse_dtb((node *)local_70,&struct_table,&strings_table);
    this_00 = &pdVar1->root;
    std::__shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2> *)local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    bVar2 = input_buffer::consume_binary<unsigned_int>(&struct_table,&token);
    if ((!bVar2) || (token != 9)) {
      __ptr = "Expected FDT_END token after parsing root node.\n";
      sStack_e0 = 0x30;
      goto LAB_001308d6;
    }
    bVar2 = (this_00->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
            (element_type *)0x0;
  }
  else {
    __ptr = "Expected FDT_BEGIN_NODE token.\n";
    sStack_e0 = 0x1f;
LAB_001308d6:
    fwrite(__ptr,sStack_e0,1,_stderr);
    bVar2 = false;
  }
  pdVar1->valid = bVar2;
LAB_0013083b:
  if (local_b8 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_b8)[2])();
  }
  return;
}

Assistant:

void
device_tree::parse_dtb(const string &fn, FILE *)
{
	auto in = input_buffer::buffer_for_file(fn);
	if (in == 0)
	{
		valid = false;
		return;
	}
	input_buffer &input = *in;
	dtb::header h;
	valid = h.read_dtb(input);
	boot_cpu = h.boot_cpuid_phys;
	if (h.last_comp_version > 17)
	{
		fprintf(stderr, "Don't know how to read this version of the device tree blob");
		valid = false;
	}
	if (!valid)
	{
		return;
	}
	input_buffer reservation_map =
		input.buffer_from_offset(h.off_mem_rsvmap, 0);
	uint64_t start, length;
	do
	{
		if (!(reservation_map.consume_binary(start) &&
		      reservation_map.consume_binary(length)))
		{
			fprintf(stderr, "Failed to read memory reservation table\n");
			valid = false;
			return;
		}
		if (start != 0 || length != 0)
		{
			reservations.push_back(reservation(start, length));
		}
	} while (!((start == 0) && (length == 0)));
	input_buffer struct_table =
		input.buffer_from_offset(h.off_dt_struct, h.size_dt_struct);
	input_buffer strings_table =
		input.buffer_from_offset(h.off_dt_strings, h.size_dt_strings);
	uint32_t token;
	if (!(struct_table.consume_binary(token) &&
		(token == dtb::FDT_BEGIN_NODE)))
	{
		fprintf(stderr, "Expected FDT_BEGIN_NODE token.\n");
		valid = false;
		return;
	}
	root = node::parse_dtb(struct_table, strings_table);
	if (!(struct_table.consume_binary(token) && (token == dtb::FDT_END)))
	{
		fprintf(stderr, "Expected FDT_END token after parsing root node.\n");
		valid = false;
		return;
	}
	valid = (root != 0);
}